

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O1

void swrenderer::R_DrawParticle_C(vissprite_t *vis)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  DWORD DVar6;
  long *plVar7;
  undefined8 *puVar8;
  short sVar9;
  uint uVar10;
  short sVar11;
  int iVar12;
  int iVar13;
  DrawerCommandQueue *this;
  long lVar14;
  byte *pbVar15;
  uint uVar16;
  int x;
  int iVar17;
  bool bVar18;
  
  bVar1 = (vis->Style).colormap[(vis->field_14).field_0.startfrac];
  iVar4 = (vis->field_3).field_1.y1;
  iVar5 = (vis->field_3).field_1.y2;
  sVar2 = vis->x1;
  iVar17 = (int)sVar2;
  sVar3 = vis->x2;
  this = (DrawerCommandQueue *)vis;
  if (FirstInterestingDrawseg < DAT_00730a14) {
    uVar10 = DAT_00730a14;
    do {
      uVar10 = uVar10 - 1;
      lVar14 = *(long *)(InterestingDrawsegs + (ulong)uVar10 * 8);
      this = drawsegs;
      if (*(int *)((long)drawsegs->memorypool + (lVar14 * 0x13 + 0xe) * 8) == 0) {
        this = (DrawerCommandQueue *)((long)drawsegs->memorypool + lVar14 * 0x13 * 8);
        sVar9 = *(short *)((long)this->memorypool + 0x18);
        if ((((sVar9 < sVar3) &&
             (sVar11 = *(short *)((long)this->memorypool + 0x1a), sVar2 < sVar11)) &&
            (iVar12 = (int)*(short *)((long)this->memorypool + 0x1c),
            ((float)((sVar3 + iVar17) / 2 - iVar12) *
            (*(float *)((long)this->memorypool + 0x2c) - *(float *)((long)this->memorypool + 0x28)))
            / (float)(*(short *)((long)this->memorypool + 0x1e) - iVar12) +
            *(float *)((long)this->memorypool + 0x28) < vis->idepth)) &&
           (*(int *)((long)this->memorypool + 0x90) == vis->CurrentPortalUniq)) {
          if (sVar9 <= sVar2) {
            sVar9 = sVar2;
          }
          if (sVar3 <= sVar11) {
            sVar11 = sVar3;
          }
          R_RenderMaskedSegRange((drawseg_t *)this,(int)sVar9,(int)sVar11);
        }
      }
    } while (FirstInterestingDrawseg < uVar10);
  }
  DrawerCommandQueue::WaitForWorkers(this);
  if (sVar2 < sVar3) {
    uVar10 = vis->renderflags * 0x100 + 0x100;
    DVar6 = Col2RGB8[(int)uVar10 >> 10][bVar1];
    iVar12 = RenderTarget->Pitch;
    do {
      drawerargs::dc_x = iVar17;
      if (CurrentPortalInSkybox == '\0') {
        bVar18 = (ulong)DAT_017b065c != 0;
        if (bVar18) {
          bVar18 = true;
          lVar14 = 0;
          do {
            plVar7 = *(long **)(portaldrawsegs + lVar14);
            iVar13 = 3;
            if ((((int)plVar7[0x12] == CurrentPortalUniq) &&
                (puVar8 = *(undefined8 **)(*plVar7 + 0x18),
                1.52587890625e-05 <
                (*(double *)*puVar8 - (double)(vis->gpos).X) * (double)puVar8[3] +
                ((double)(vis->gpos).Y - ((double *)*puVar8)[1]) * (double)puVar8[2])) &&
               ((iVar17 < (short)plVar7[3] ||
                (iVar13 = 1, *(short *)((long)plVar7 + 0x1a) <= iVar17)))) {
              iVar13 = 0;
            }
            if ((iVar13 != 3) && (iVar13 != 0)) break;
            lVar14 = lVar14 + 8;
            bVar18 = (ulong)DAT_017b065c << 3 != lVar14;
          } while (bVar18);
        }
        if (!(bool)(iVar5 < iVar4 | bVar18)) goto LAB_002efc44;
      }
      else if (iVar4 <= iVar5) {
LAB_002efc44:
        pbVar15 = (byte *)((long)iVar17 + (long)(int)(&ylookup)[iVar4] + drawerargs::dc_destorg);
        iVar13 = (iVar5 - iVar4) + 1;
        do {
          uVar16 = Col2RGB8[(int)(0x10000 - (uVar10 & 0xfffffc00)) >> 10][*pbVar15] + DVar6 |
                   0x1f07c1f;
          *pbVar15 = RGB32k.All[uVar16 >> 0xf & uVar16];
          pbVar15 = pbVar15 + iVar12;
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 != sVar3);
  }
  return;
}

Assistant:

void R_DrawParticle_C (vissprite_t *vis)
{
	DWORD *bg2rgb;
	int spacing;
	BYTE *dest;
	DWORD fg;
	BYTE color = vis->Style.colormap[vis->startfrac];
	int yl = vis->y1;
	int ycount = vis->y2 - yl + 1;
	int x1 = vis->x1;
	int countbase = vis->x2 - x1;

	R_DrawMaskedSegsBehindParticle (vis);

	DrawerCommandQueue::WaitForWorkers();

	// vis->renderflags holds translucency level (0-255)
	{
		fixed_t fglevel, bglevel;
		DWORD *fg2rgb;

		fglevel = ((vis->renderflags + 1) << 8) & ~0x3ff;
		bglevel = FRACUNIT-fglevel;
		fg2rgb = Col2RGB8[fglevel>>10];
		bg2rgb = Col2RGB8[bglevel>>10];
		fg = fg2rgb[color];
	}

	/*

	spacing = RenderTarget->GetPitch() - countbase;
	dest = ylookup[yl] + x1 + dc_destorg;

	do
	{
		int count = countbase;
		do
		{
			DWORD bg = bg2rgb[*dest];
			bg = (fg+bg) | 0x1f07c1f;
			*dest++ = RGB32k.All[bg & (bg>>15)];
		} while (--count);
		dest += spacing;
	} while (--ycount);*/

	// original was row-wise
	// width = countbase
	// height = ycount

	spacing = RenderTarget->GetPitch();

	for (int x = x1; x < (x1+countbase); x++)
	{
		dc_x = x;
		if (R_ClipSpriteColumnWithPortals(vis))
			continue;
		dest = ylookup[yl] + x + dc_destorg;
		for (int y = 0; y < ycount; y++)
		{
			DWORD bg = bg2rgb[*dest];
			bg = (fg+bg) | 0x1f07c1f;
			*dest = RGB32k.All[bg & (bg>>15)];
			dest += spacing;
		}
	}
}